

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

int __thiscall
CTcTokenizer::load_macros_from_file(CTcTokenizer *this,CVmStream *fp,CTcTokLoadMacErr *err_handler)

{
  int iVar1;
  uint uVar2;
  uint argc;
  uint uVar3;
  int iVar4;
  int extraout_var;
  char *pcVar5;
  undefined4 extraout_var_00;
  long *plVar6;
  void *__s1;
  CTcHashEntryPpDefine *this_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  char *local_8d8;
  ulong local_8b0;
  char namebuf [80];
  char *argv [128];
  size_t argvlen [128];
  undefined4 extraout_var_01;
  
  local_8b0 = 0x400;
  local_8d8 = (char *)malloc(0x400);
  iVar1 = (*fp->_vptr_CVmStream[8])(fp);
  if (CONCAT44(extraout_var,iVar1) == 0 || extraout_var < 0) {
    iVar1 = 0;
  }
  else {
    lVar10 = 0;
    uVar11 = 0;
    do {
      uVar2 = (*fp->_vptr_CVmStream[6])(fp);
      if (0x50 < uVar2) {
        iVar1 = 1;
LAB_00254d36:
        (*(code *)**(undefined8 **)err_handler)(err_handler,iVar1);
        goto LAB_00254d46;
      }
      uVar7 = (ulong)uVar2;
      (*fp->_vptr_CVmStream[0xe])(fp,namebuf);
      uVar2 = (*fp->_vptr_CVmStream[6])(fp);
      argc = (*fp->_vptr_CVmStream[6])(fp);
      if (argc != 0) {
        uVar8 = 1;
        uVar9 = 0;
        do {
          uVar3 = (*fp->_vptr_CVmStream[6])(fp);
          argvlen[uVar9] = (ulong)uVar3;
          if (0x50 < uVar3) {
            iVar1 = 2;
            goto LAB_00254d36;
          }
          uVar12 = uVar11;
          if (uVar11 <= uVar9) {
            do {
              pcVar5 = (char *)malloc(0x50);
              argv[uVar12] = pcVar5;
              uVar12 = uVar12 + 1;
              uVar11 = uVar8;
            } while (uVar8 != uVar12);
          }
          (*fp->_vptr_CVmStream[0xe])(fp,argv[uVar9],(ulong)uVar3);
          uVar9 = uVar9 + 1;
          uVar8 = uVar8 + 1;
        } while (uVar9 != argc);
      }
      iVar4 = (*fp->_vptr_CVmStream[8])(fp);
      uVar8 = CONCAT44(extraout_var_00,iVar4);
      if (local_8b0 < uVar8) {
        local_8b0 = uVar8 + 0x200;
        local_8d8 = (char *)realloc(local_8d8,local_8b0);
      }
      uVar3 = uVar2 >> 1 & 1;
      (*fp->_vptr_CVmStream[0xe])(fp,local_8d8,uVar8);
      iVar4 = (*this->defines_->_vptr_CTcMacroTable[4])(this->defines_,namebuf,uVar7);
      plVar6 = (long *)CONCAT44(extraout_var_01,iVar4);
      if (plVar6 == (long *)0x0) {
        this_00 = (CTcHashEntryPpDefine *)operator_new(0x68);
        CTcHashEntryPpDefine::CTcHashEntryPpDefine
                  (this_00,namebuf,uVar7,1,uVar2 & 1,argc,uVar3,argv,argvlen,local_8d8,uVar8);
        (*this->defines_->_vptr_CTcMacroTable[2])(this->defines_,this_00);
      }
      else {
        iVar4 = (**(code **)(*plVar6 + 0x40))(plVar6);
        if ((((iVar4 == 0) && ((uVar2 & 1) == (*(byte *)((long)plVar6 + 0x44) & 1))) &&
            (uVar3 == ((*(byte *)((long)plVar6 + 0x44) >> 1 & 1) != 0))) &&
           ((*(uint *)(plVar6 + 8) == argc &&
            (uVar9 = (**(code **)(*plVar6 + 0x30))(plVar6), uVar9 == uVar8)))) {
          __s1 = (void *)(**(code **)(*plVar6 + 0x28))(plVar6);
          iVar4 = bcmp(__s1,local_8d8,uVar8);
          if (iVar4 == 0) goto LAB_00254d16;
        }
        iVar4 = (**(code **)(*plVar6 + 0x40))(plVar6);
        if (iVar4 == 0) {
          undefine(this,namebuf,uVar7);
        }
      }
LAB_00254d16:
      lVar10 = lVar10 + 1;
    } while (lVar10 != CONCAT44(extraout_var,iVar1));
    iVar1 = 0;
LAB_00254d46:
    if (uVar11 != 0) {
      uVar7 = 0;
      do {
        free(argv[uVar7]);
        uVar7 = uVar7 + 1;
      } while (uVar11 != uVar7);
    }
  }
  free(local_8d8);
  return iVar1;
}

Assistant:

int CTcTokenizer::load_macros_from_file(CVmStream *fp,
                                        CTcTokLoadMacErr *err_handler)
{
    long cnt;
    long i;
    size_t curarg;
    char *argv[TOK_MAX_MACRO_ARGS];
    size_t argvlen[TOK_MAX_MACRO_ARGS];
    size_t maxarg;
    int result;
    char *expan;
    size_t expmaxlen;

    /* we haven't allocated any argument buffers yet */
    maxarg = 0;

    /* allocate an initial expansion buffer */
    expmaxlen = 1024;
    expan = (char *)t3malloc(expmaxlen);

    /* presume success */
    result = 0;

    /* read the number of macros */
    cnt = fp->read_uint4();

    /* read each macro */
    for (i = 0 ; i < cnt ; ++i)
    {
        char namebuf[TOK_SYM_MAX_LEN];
        size_t namelen;
        int flags;
        size_t argc;
        size_t explen;
        CTcHashEntryPp *entry;
        int has_args;
        int has_varargs;

        /* read the name's length */
        namelen = fp->read_uint2();
        if (namelen > sizeof(namebuf))
        {
            /* log an error through the handler */
            err_handler->log_error(1);

            /* give up - we can't read any more of the file */
            result = 1;
            goto done;
        }

        /* read the name */
        fp->read_bytes(namebuf, namelen);

        /* read and decode the flags */
        flags = fp->read_uint2();
        has_args = ((flags & 1) != 0);
        has_varargs = ((flags & 2) != 0);

        /* read the number of arguments, and read each argument */
        argc = fp->read_uint2();
        for (curarg = 0 ; curarg < argc ; ++curarg)
        {
            /* read the length, and make sure it's valid */
            argvlen[curarg] = fp->read_uint2();
            if (argvlen[curarg] > TOK_SYM_MAX_LEN)
            {
                /* log an error */
                err_handler->log_error(2);

                /* give up - we can't read any more of the file */
                result = 2;
                goto done;
            }

            /* 
             *   if we haven't allocated a buffer for this argument slot yet,
             *   allocate it now; allocate the buffer at the maximum symbol
             *   size, so we can reuse the same buffer for an argument of
             *   other macros we read later 
             */
            while (curarg >= maxarg)
                argv[maxarg++] = (char *)t3malloc(TOK_SYM_MAX_LEN);

            /* read the argument text */
            fp->read_bytes(argv[curarg], argvlen[curarg]);
        }

        /* read the expansion size */
        explen = (size_t)fp->read_uint4();

        /* expand the expansion buffer if necessary */
        if (explen > expmaxlen)
        {
            /* 
             *   overshoot a bit, so that we won't have to reallocate again
             *   if we find a slightly larger expansion for a future macro 
             */
            expmaxlen = explen + 512;

            /* allocate the new buffer */
            expan = (char *)t3realloc(expan, expmaxlen);
        }

        /* read the expansion */
        fp->read_bytes(expan, explen);

        /*
         *   Before we create the entry, check to see if there's an existing
         *   entry with the same name.  
         */
        entry = find_define(namebuf, namelen);
        if (entry != 0)
        {
            /*
             *   We have another entry.  If the entry is exactly the same,
             *   then we can simply skip the current entry, because we simply
             *   want to keep one copy of each macro that's defined
             *   identically in mutiple compilation macros.  If the entry is
             *   different from the new one, delete both - a macro which
             *   appears in two or more compilation units with different
             *   meanings is NOT a global macro, and thus we can't include it
             *   in the debugging records.  
             */
            if (entry->is_pseudo()
                || entry->has_args() != has_args
                || entry->has_varargs() != has_varargs
                || entry->get_argc() != (int)argc
                || entry->get_orig_expan_len() != explen
                || memcmp(entry->get_orig_expansion(), expan, explen) != 0)
            {
                /*
                 *   The existing entry is different from the new entry, so
                 *   the macro has different meanings in different
                 *   compilation units, hence we cannot keep *either*
                 *   definition in the debug records.  Delete the existing
                 *   macro, and do not create the new macro.  If the existing
                 *   macro is a pseudo-macro, keep the old one (since it's
                 *   provided by the compiler itself), but still discard the
                 *   new one.  
                 */
                if (!entry->is_pseudo())
                    undefine(namebuf, namelen);
            }
            else
            {
                /*
                 *   The new entry is identical to the old one, so keep it.
                 *   We only need one copy of the entry, though, so simply
                 *   keep the old one - there's no need to create a new entry
                 *   for the object file data.  
                 */
            }
        }
        else
        {
            /*
             *   There's no existing macro with the same name, so create a
             *   new entry based on the object file data.  
             */
            entry = new CTcHashEntryPpDefine(namebuf, namelen, TRUE,
                                             has_args, argc, has_varargs,
                                             (const char **)argv, argvlen,
                                             expan, explen);

            /* add it to the preprocessor's macro symbol table */
            add_define(entry);
        }
    }

done:
    /* free the argument buffers we allocated */
    for (curarg = 0 ; curarg < maxarg ; ++curarg)
        t3free(argv[curarg]);

    /* free the expansion buffer */
    t3free(expan);

    /* success */
    return result;
}